

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O1

string * perf::format_code_position
                   (string *__return_storage_ptr__,string *file,size_t line,string *function)

{
  ostream *poVar1;
  pthread_t pVar2;
  stringstream strm;
  char local_1b9;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1b9 = '#';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1b9,1);
  pVar2 = pthread_self();
  if (pVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"thread::id of a non-executing thread",0x24);
  }
  else {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  local_1b9 = ':';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1b9,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(file->_M_dataplus)._M_p,file->_M_string_length);
  local_1b9 = ':';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1b9,1);
  if (function->_M_string_length != 0) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(function->_M_dataplus)._M_p,function->_M_string_length);
    local_1b9 = ':';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1b9,1);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string format_code_position(const std::string &file, std::size_t line, const std::string &function = "")
    {
        std::stringstream strm;
        strm << '#' << std::this_thread::get_id() << ':' << file << ':';
        if (!function.empty())
            strm << function << ':';
        strm << line;
        return strm.str();
    }